

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O3

void __thiscall mocker::Lexer::keywordsOrIdentifier(Lexer *this,string *curTok)

{
  size_type sVar1;
  pointer pcVar2;
  int iVar3;
  const_iterator cVar4;
  LexError *this_00;
  int iVar5;
  long lVar6;
  size_type sVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  undefined1 local_29b;
  undefined1 local_29a;
  undefined1 local_299;
  TokenID local_298 [14];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::TokenID>
  local_260;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::TokenID>
  local_238;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::TokenID>
  local_210;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::TokenID>
  local_1e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::TokenID>
  local_1c0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::TokenID>
  local_198;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::TokenID>
  local_170;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::TokenID>
  local_148;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::TokenID>
  local_120;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::TokenID>
  local_f8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::TokenID>
  local_d0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::TokenID>
  local_a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::TokenID>
  local_80;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::TokenID>
  local_58;
  
  if (keywordsOrIdentifier(std::__cxx11::string_const&)::kw_abi_cxx11_ == '\0') {
    iVar3 = __cxa_guard_acquire(&keywordsOrIdentifier(std::__cxx11::string_const&)::kw_abi_cxx11_);
    if (iVar3 != 0) {
      local_298[0xd] = 2;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::TokenID>
      ::pair<const_char_(&)[5],_mocker::TokenID,_true>
                (&local_260,(char (*) [5])"bool",local_298 + 0xd);
      local_298[0xc] = 3;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::TokenID>
      ::pair<const_char_(&)[4],_mocker::TokenID,_true>
                (&local_238,(char (*) [4])0x1a95c0,local_298 + 0xc);
      local_298[0xb] = 4;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::TokenID>
      ::pair<const_char_(&)[7],_mocker::TokenID,_true>
                (&local_210,(char (*) [7])0x1a9856,local_298 + 0xb);
      local_298[10] = 5;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::TokenID>
      ::pair<const_char_(&)[5],_mocker::TokenID,_true>
                (&local_1e8,(char (*) [5])"void",local_298 + 10);
      local_298[9] = 6;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::TokenID>
      ::pair<const_char_(&)[5],_mocker::TokenID,_true>
                (&local_1c0,(char (*) [5])0x1a9481,local_298 + 9);
      local_298[8] = 7;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::TokenID>
      ::pair<const_char_(&)[3],_mocker::TokenID,_true>(&local_198,(char (*) [3])"if",local_298 + 8);
      local_298[7] = 8;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::TokenID>
      ::pair<const_char_(&)[5],_mocker::TokenID,_true>
                (&local_170,(char (*) [5])"else",local_298 + 7);
      local_298[6] = 9;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::TokenID>
      ::pair<const_char_(&)[4],_mocker::TokenID,_true>(&local_148,(char (*) [4])"for",local_298 + 6)
      ;
      local_298[5] = 10;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::TokenID>
      ::pair<const_char_(&)[6],_mocker::TokenID,_true>
                (&local_120,(char (*) [6])"while",local_298 + 5);
      local_298[4] = 0xb;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::TokenID>
      ::pair<const_char_(&)[6],_mocker::TokenID,_true>
                (&local_f8,(char (*) [6])"break",local_298 + 4);
      local_298[3] = 0xc;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::TokenID>
      ::pair<const_char_(&)[9],_mocker::TokenID,_true>
                (&local_d0,(char (*) [9])"continue",local_298 + 3);
      local_298[2] = 0xd;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::TokenID>
      ::pair<const_char_(&)[7],_mocker::TokenID,_true>
                (&local_a8,(char (*) [7])"return",local_298 + 2);
      local_298[1] = 0xe;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::TokenID>
      ::pair<const_char_(&)[4],_mocker::TokenID,_true>(&local_80,(char (*) [4])"new",local_298 + 1);
      local_298[0] = Class;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::TokenID>
      ::pair<const_char_(&)[6],_mocker::TokenID,_true>(&local_58,(char (*) [6])"class",local_298);
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,mocker::TokenID>,std::allocator<std::pair<std::__cxx11::string_const,mocker::TokenID>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_Hashtable<std::pair<std::__cxx11::string_const,mocker::TokenID>const*>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,mocker::TokenID>,std::allocator<std::pair<std::__cxx11::string_const,mocker::TokenID>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&keywordsOrIdentifier(std::__cxx11::string_const&)::kw_abi_cxx11_,&local_260,
                 &stack0xffffffffffffffd0,0,&local_299,&local_29a,&local_29b);
      lVar6 = -0x230;
      paVar8 = &local_58.first.field_2;
      do {
        if (paVar8 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(&paVar8->_M_allocated_capacity)[-2]) {
          operator_delete((long *)(&paVar8->_M_allocated_capacity)[-2],
                          paVar8->_M_allocated_capacity + 1);
        }
        paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(&paVar8->_M_allocated_capacity + -5);
        lVar6 = lVar6 + 0x28;
      } while (lVar6 != 0);
      __cxa_atexit(std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::TokenID,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::TokenID>_>_>
                   ::~unordered_map,
                   &keywordsOrIdentifier(std::__cxx11::string_const&)::kw_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&keywordsOrIdentifier(std::__cxx11::string_const&)::kw_abi_cxx11_);
    }
  }
  cVar4 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::TokenID>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::TokenID>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&keywordsOrIdentifier(std::__cxx11::string_const&)::kw_abi_cxx11_._M_h,curTok);
  if (cVar4.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::TokenID>,_true>
      ._M_cur == (__node_type *)0x0) {
    sVar1 = curTok->_M_string_length;
    if (sVar1 != 0) {
      pcVar2 = (curTok->_M_dataplus)._M_p;
      sVar7 = 0;
      do {
        iVar5 = (int)pcVar2[sVar7];
        iVar3 = isalnum(iVar5);
        if ((iVar5 != 0x5f) && (iVar3 == 0)) {
          this_00 = (LexError *)__cxa_allocate_exception(0x48);
          LexError::LexError(this_00,this->curPos,this->nxtPos);
          __cxa_throw(this_00,&LexError::typeinfo,CompileError::~CompileError);
        }
        sVar7 = sVar7 + 1;
      } while (sVar1 != sVar7);
    }
    local_260.first._M_dataplus._M_p._0_4_ = 1;
    std::vector<mocker::Token,std::allocator<mocker::Token>>::
    emplace_back<mocker::TokenID,mocker::Position&,mocker::Position&,std::__cxx11::string_const&>
              ((vector<mocker::Token,std::allocator<mocker::Token>> *)&this->tokens,
               (TokenID *)&local_260,&this->curPos,&this->nxtPos,curTok);
  }
  else {
    std::vector<mocker::Token,std::allocator<mocker::Token>>::
    emplace_back<mocker::TokenID_const&,mocker::Position&,mocker::Position&>
              ((vector<mocker::Token,std::allocator<mocker::Token>> *)&this->tokens,
               (TokenID *)
               ((long)cVar4.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::TokenID>,_true>
                      ._M_cur + 0x28),&this->curPos,&this->nxtPos);
  }
  return;
}

Assistant:

void Lexer::keywordsOrIdentifier(const std::string &curTok) {
  static const std::unordered_map<std::string, TokenID> kw = {
      {"bool", TokenID::Bool},         {"int", TokenID::Int},
      {"string", TokenID::String},     {"void", TokenID::Void},
      {"null", TokenID::Null},         {"if", TokenID::If},
      {"else", TokenID::Else},         {"for", TokenID::For},
      {"while", TokenID::While},       {"break", TokenID::Break},
      {"continue", TokenID::Continue}, {"return", TokenID::Return},
      {"new", TokenID::New},           {"class", TokenID::Class},
      //      {"this", TokenID::This}
  };
  auto iter = kw.find(curTok);
  if (iter != kw.end()) {
    tokens.emplace_back(iter->second, curPos, nxtPos);
    return;
  }
  for (auto ch : curTok)
    if (!std::isalnum(ch) && ch != '_')
      throw LexError(curPos, nxtPos);
  tokens.emplace_back(TokenID::Identifier, curPos, nxtPos, curTok);
}